

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LWSLoader.cpp
# Opt level: O1

void __thiscall
Assimp::LWSImporter::BuildGraph
          (LWSImporter *this,aiNode *nd,NodeDesc *src,
          vector<Assimp::AttachmentInfo,_std::allocator<Assimp::AttachmentInfo>_> *attach,
          BatchLoader *batch,aiCamera ***camOut,aiLight ***lightOut,
          vector<aiNodeAnim_*,_std::allocator<aiNodeAnim_*>_> *animOut)

{
  pointer *ppAVar1;
  pointer *pppaVar2;
  double dVar3;
  anon_enum_32 aVar4;
  uint uVar5;
  aiLight **ppaVar6;
  aiCamera **ppaVar7;
  iterator __position;
  ulong uVar8;
  double dVar9;
  iterator __position_00;
  aiNodeAnim *paVar10;
  Logger *this_00;
  long *plVar11;
  aiNode **ppaVar12;
  aiNode *paVar13;
  list<Assimp::LWO::Envelope,_std::allocator<Assimp::LWO::Envelope>_> *plVar14;
  aiNode *paVar15;
  _List_node_base *p_Var16;
  float fVar17;
  float fVar18;
  float fVar19;
  aiScene *local_128;
  aiNodeAnim *anim;
  undefined1 local_f8 [24];
  AnimResolver resolver;
  
  SetupNodeName(this,nd,src);
  aVar4 = src->type;
  paVar15 = nd;
  if (aVar4 == CAMERA) {
    paVar13 = (aiNode *)operator_new(0x438);
    (paVar13->mName).length = 0;
    (paVar13->mName).data[0] = '\0';
    memset((paVar13->mName).data + 1,0x1b,0x3ff);
    (paVar13->mTransformation).a1 = 0.0;
    (paVar13->mTransformation).a2 = 0.0;
    (paVar13->mTransformation).a3 = 0.0;
    (paVar13->mTransformation).a4 = 0.0;
    (paVar13->mTransformation).b1 = 1.0;
    (paVar13->mTransformation).b2 = 0.0;
    (paVar13->mTransformation).b3 = 0.0;
    (paVar13->mTransformation).b4 = 0.0;
    (paVar13->mTransformation).c1 = 1.0;
    (paVar13->mTransformation).c2 = 0.7853982;
    (paVar13->mTransformation).c3 = 0.1;
    (paVar13->mTransformation).c4 = 1000.0;
    (paVar13->mTransformation).d1 = 0.0;
    ppaVar7 = *camOut;
    *camOut = ppaVar7 + 1;
    *ppaVar7 = (aiCamera *)paVar13;
    if (paVar13 != nd) {
      uVar5 = (nd->mName).length;
      (paVar13->mName).length = uVar5;
      memcpy((paVar13->mName).data,(nd->mName).data,(ulong)uVar5);
      (paVar13->mName).data[uVar5] = '\0';
    }
    goto LAB_0044b4ac;
  }
  if (aVar4 == LIGHT) {
    paVar13 = (aiNode *)operator_new(0x46c);
    (paVar13->mName).length = 0;
    (paVar13->mName).data[0] = '\0';
    memset((paVar13->mName).data + 1,0x1b,0x3ff);
    (paVar13->mTransformation).a1 = 0.0;
    (paVar13->mTransformation).a2 = 0.0;
    (paVar13->mTransformation).a3 = 0.0;
    (paVar13->mTransformation).a4 = 0.0;
    (paVar13->mTransformation).b1 = 0.0;
    (paVar13->mTransformation).b2 = 0.0;
    (paVar13->mTransformation).b3 = 0.0;
    (paVar13->mTransformation).b4 = 0.0;
    (paVar13->mTransformation).b4 = 0.0;
    (paVar13->mTransformation).c1 = 0.0;
    (paVar13->mTransformation).c2 = 0.0;
    (paVar13->mTransformation).c3 = 0.0;
    (paVar13->mTransformation).c4 = 1.0;
    (paVar13->mTransformation).d1 = 0.0;
    (paVar13->mTransformation).d2 = 0.0;
    (paVar13->mTransformation).d3 = 0.0;
    (paVar13->mTransformation).d4 = 0.0;
    *(undefined8 *)&paVar13->field_0x444 = 0;
    *(undefined8 *)((long)&paVar13->mParent + 4) = 0;
    *(undefined8 *)&paVar13->field_0x454 = 0;
    *(undefined8 *)((long)&paVar13->mChildren + 4) = 0x40c90fdb40c90fdb;
    *(undefined8 *)&paVar13->field_0x464 = 0;
    ppaVar6 = *lightOut;
    *lightOut = ppaVar6 + 1;
    *ppaVar6 = (aiLight *)paVar13;
    fVar17 = src->lightIntensity;
    fVar18 = (src->lightColor).r * fVar17;
    fVar19 = (src->lightColor).g * fVar17;
    fVar17 = fVar17 * (src->lightColor).b;
    *(float *)&paVar13->field_0x444 = fVar18;
    *(float *)&paVar13->mParent = fVar19;
    *(float *)((long)&paVar13->mParent + 4) = fVar17;
    (paVar13->mTransformation).d2 = fVar18;
    (paVar13->mTransformation).d3 = fVar19;
    (paVar13->mTransformation).d4 = fVar17;
    if (paVar13 != nd) {
      uVar5 = (nd->mName).length;
      (paVar13->mName).length = uVar5;
      memcpy((paVar13->mName).data,(nd->mName).data,(ulong)uVar5);
      (paVar13->mName).data[uVar5] = '\0';
    }
    if (src->lightType == 1) {
      (paVar13->mTransformation).a1 = 1.4013e-45;
    }
    else if (src->lightType == 2) {
      (paVar13->mTransformation).a1 = 4.2039e-45;
      fVar17 = src->lightConeAngle * 0.017453292;
      *(float *)((long)&paVar13->mChildren + 4) = fVar17;
      paVar13->mNumMeshes = (uint)(src->lightEdgeAngle * 0.017453292 + fVar17);
    }
    else {
      (paVar13->mTransformation).a1 = 2.8026e-45;
    }
    if (src->lightFalloffType == 1) {
      (paVar13->mTransformation).c3 = 1.0;
    }
    else {
      (paVar13->mTransformation).d1 = 1.0;
    }
    goto LAB_0044b4ac;
  }
  if (aVar4 != OBJECT) goto LAB_0044b4ac;
  if ((src->path)._M_string_length == 0) {
LAB_0044b6aa:
    local_128 = (aiScene *)0x0;
  }
  else {
    local_128 = BatchLoader::GetImport(batch,src->id);
    if (local_128 == (aiScene *)0x0) {
      this_00 = DefaultLogger::get();
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&resolver,
                     "LWS: Failed to read external file ",&src->path);
      Logger::error(this_00,(char *)resolver.envelopes);
      if (resolver.envelopes !=
          (list<Assimp::LWO::Envelope,_std::allocator<Assimp::LWO::Envelope>_> *)&resolver.trans_x)
      {
        operator_delete(resolver.envelopes);
      }
      goto LAB_0044b6aa;
    }
    if (local_128->mRootNode->mNumChildren == 1) {
      if (src->isPivotSet == false) {
        (src->pivotPos).x = (local_128->mRootNode->mTransformation).a4;
        (src->pivotPos).y = (local_128->mRootNode->mTransformation).b4;
        (src->pivotPos).z = -(local_128->mRootNode->mTransformation).c4;
      }
      ppaVar12 = local_128->mRootNode->mChildren;
      paVar15 = *ppaVar12;
      *ppaVar12 = (aiNode *)0x0;
      paVar13 = local_128->mRootNode;
      if (paVar13 != (aiNode *)0x0) {
        aiNode::~aiNode(paVar13);
        operator_delete(paVar13);
      }
      local_128->mRootNode = paVar15;
      (paVar15->mTransformation).a4 = 0.0;
      (local_128->mRootNode->mTransformation).b4 = 0.0;
      (local_128->mRootNode->mTransformation).c4 = 0.0;
    }
  }
  anim = (aiNodeAnim *)local_f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&anim,"Pivot:","");
  plVar11 = (long *)std::__cxx11::string::append((char *)&anim);
  plVar14 = (list<Assimp::LWO::Envelope,_std::allocator<Assimp::LWO::Envelope>_> *)(plVar11 + 2);
  if ((list<Assimp::LWO::Envelope,_std::allocator<Assimp::LWO::Envelope>_> *)*plVar11 == plVar14) {
    resolver.trans_x =
         (Envelope *)
         (plVar14->super__List_base<Assimp::LWO::Envelope,_std::allocator<Assimp::LWO::Envelope>_>).
         _M_impl._M_node.super__List_node_base._M_next;
    resolver.trans_y = (Envelope *)plVar11[3];
    resolver.envelopes =
         (list<Assimp::LWO::Envelope,_std::allocator<Assimp::LWO::Envelope>_> *)&resolver.trans_x;
  }
  else {
    resolver.trans_x =
         (Envelope *)
         (plVar14->super__List_base<Assimp::LWO::Envelope,_std::allocator<Assimp::LWO::Envelope>_>).
         _M_impl._M_node.super__List_node_base._M_next;
    resolver.envelopes =
         (list<Assimp::LWO::Envelope,_std::allocator<Assimp::LWO::Envelope>_> *)*plVar11;
  }
  dVar9 = (double)plVar11[1];
  *plVar11 = (long)plVar14;
  plVar11[1] = 0;
  *(undefined1 *)(plVar11 + 2) = 0;
  resolver.sample_rate = dVar9;
  if ((ulong)dVar9 < 0x400) {
    (nd->mName).length = SUB84(dVar9,0);
    memcpy((nd->mName).data,resolver.envelopes,(size_t)dVar9);
    (nd->mName).data[(long)dVar9] = '\0';
  }
  if (resolver.envelopes !=
      (list<Assimp::LWO::Envelope,_std::allocator<Assimp::LWO::Envelope>_> *)&resolver.trans_x) {
    operator_delete(resolver.envelopes);
  }
  if (anim != (aiNodeAnim *)local_f8) {
    operator_delete(anim);
  }
  nd->mNumChildren = 1;
  ppaVar12 = (aiNode **)operator_new__(8);
  nd->mChildren = ppaVar12;
  paVar13 = (aiNode *)operator_new(0x478);
  paVar15 = paVar13;
  aiNode::aiNode(paVar13);
  *nd->mChildren = paVar13;
  (*nd->mChildren)->mParent = nd;
  ((*nd->mChildren)->mTransformation).a4 = -(src->pivotPos).x;
  ((*nd->mChildren)->mTransformation).b4 = -(src->pivotPos).y;
  ((*nd->mChildren)->mTransformation).c4 = -(src->pivotPos).z;
  SetupNodeName((LWSImporter *)paVar15,*nd->mChildren,src);
  paVar15 = *nd->mChildren;
  if (local_128 != (aiScene *)0x0) {
    resolver.envelopes =
         (list<Assimp::LWO::Envelope,_std::allocator<Assimp::LWO::Envelope>_> *)local_128;
    __position_00._M_current =
         (attach->
         super__Vector_base<Assimp::AttachmentInfo,_std::allocator<Assimp::AttachmentInfo>_>).
         _M_impl.super__Vector_impl_data._M_finish;
    resolver.sample_rate = (double)paVar15;
    if (__position_00._M_current ==
        (attach->super__Vector_base<Assimp::AttachmentInfo,_std::allocator<Assimp::AttachmentInfo>_>
        )._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<Assimp::AttachmentInfo,_std::allocator<Assimp::AttachmentInfo>_>::
      _M_realloc_insert<Assimp::AttachmentInfo>(attach,__position_00,(AttachmentInfo *)&resolver);
    }
    else {
      (__position_00._M_current)->scene = local_128;
      (__position_00._M_current)->attachToNode = paVar15;
      ppAVar1 = &(attach->
                 super__Vector_base<Assimp::AttachmentInfo,_std::allocator<Assimp::AttachmentInfo>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
      *ppAVar1 = *ppAVar1 + 1;
      resolver.envelopes =
           (list<Assimp::LWO::Envelope,_std::allocator<Assimp::LWO::Envelope>_> *)local_128;
    }
  }
LAB_0044b4ac:
  LWO::AnimResolver::AnimResolver(&resolver,&src->channels,this->fps);
  local_f8._16_8_ = nd;
  LWO::AnimResolver::ExtractBindPose(&resolver,&nd->mTransformation);
  anim = (aiNodeAnim *)0x0;
  dVar9 = this->first;
  dVar3 = this->last;
  if ((dVar9 != dVar3) || (NAN(dVar9) || NAN(dVar3))) {
    resolver.first = dVar9;
    resolver.last = dVar3;
    LWO::AnimResolver::ClearAnimRangeSetup(&resolver);
    LWO::AnimResolver::UpdateAnimRangeSetup(&resolver);
    LWO::AnimResolver::ExtractAnimChannel(&resolver,&anim,3);
    paVar10 = anim;
    if (anim != (aiNodeAnim *)0x0) {
      if (anim != (aiNodeAnim *)local_f8._16_8_) {
        uVar5 = ((aiString *)local_f8._16_8_)->length;
        (anim->mNodeName).length = uVar5;
        memcpy((anim->mNodeName).data,((aiString *)local_f8._16_8_)->data,(ulong)uVar5);
        (paVar10->mNodeName).data[uVar5] = '\0';
      }
      __position._M_current =
           (animOut->super__Vector_base<aiNodeAnim_*,_std::allocator<aiNodeAnim_*>_>)._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (animOut->super__Vector_base<aiNodeAnim_*,_std::allocator<aiNodeAnim_*>_>)._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<aiNodeAnim*,std::allocator<aiNodeAnim*>>::_M_realloc_insert<aiNodeAnim*const&>
                  ((vector<aiNodeAnim*,std::allocator<aiNodeAnim*>> *)animOut,__position,&anim);
      }
      else {
        *__position._M_current = anim;
        pppaVar2 = &(animOut->super__Vector_base<aiNodeAnim_*,_std::allocator<aiNodeAnim_*>_>).
                    _M_impl.super__Vector_impl_data._M_finish;
        *pppaVar2 = *pppaVar2 + 1;
      }
    }
  }
  if ((src->children).
      super__List_base<Assimp::LWS::NodeDesc_*,_std::allocator<Assimp::LWS::NodeDesc_*>_>._M_impl.
      _M_node.super__List_node_base._M_next != (_List_node_base *)&src->children) {
    uVar8 = (src->children).
            super__List_base<Assimp::LWS::NodeDesc_*,_std::allocator<Assimp::LWS::NodeDesc_*>_>.
            _M_impl._M_node._M_size;
    ppaVar12 = (aiNode **)operator_new__(-(ulong)(uVar8 >> 0x3d != 0) | uVar8 << 3);
    paVar15->mChildren = ppaVar12;
    for (p_Var16 = (src->children).
                   super__List_base<Assimp::LWS::NodeDesc_*,_std::allocator<Assimp::LWS::NodeDesc_*>_>
                   ._M_impl._M_node.super__List_node_base._M_next;
        p_Var16 != (_List_node_base *)&src->children; p_Var16 = p_Var16->_M_next) {
      paVar13 = (aiNode *)operator_new(0x478);
      aiNode::aiNode(paVar13);
      uVar5 = paVar15->mNumChildren;
      paVar15->mNumChildren = uVar5 + 1;
      paVar15->mChildren[uVar5] = paVar13;
      paVar13->mParent = paVar15;
      BuildGraph(this,paVar13,(NodeDesc *)p_Var16[1]._M_next,attach,batch,camOut,lightOut,animOut);
    }
  }
  return;
}

Assistant:

void LWSImporter::BuildGraph(aiNode* nd, LWS::NodeDesc& src, std::vector<AttachmentInfo>& attach,
    BatchLoader& batch,
    aiCamera**& camOut,
    aiLight**& lightOut,
    std::vector<aiNodeAnim*>& animOut)
{
    // Setup a very cryptic name for the node, we want the user to be happy
    SetupNodeName(nd,src);
    aiNode* ndAnim = nd;

    // If the node is an object
    if (src.type == LWS::NodeDesc::OBJECT) {

        // If the object is from an external file, get it
        aiScene* obj = NULL;
        if (src.path.length() ) {
            obj = batch.GetImport(src.id);
            if (!obj) {
                ASSIMP_LOG_ERROR("LWS: Failed to read external file " + src.path);
            }
            else {
                if (obj->mRootNode->mNumChildren == 1) {

                    //If the pivot is not set for this layer, get it from the external object
                    if (!src.isPivotSet) {
                        src.pivotPos.x = +obj->mRootNode->mTransformation.a4;
                        src.pivotPos.y = +obj->mRootNode->mTransformation.b4;
                        src.pivotPos.z = -obj->mRootNode->mTransformation.c4; //The sign is the RH to LH back conversion
                    }

                    //Remove first node from obj (the old pivot), reset transform of second node (the mesh node)
                    aiNode* newRootNode = obj->mRootNode->mChildren[0];
                    obj->mRootNode->mChildren[0] = NULL;
                    delete obj->mRootNode;

                    obj->mRootNode = newRootNode;
                    obj->mRootNode->mTransformation.a4 = 0.0;
                    obj->mRootNode->mTransformation.b4 = 0.0;
                    obj->mRootNode->mTransformation.c4 = 0.0;
                }
            }
        }

        //Setup the pivot node (also the animation node), the one we received
        nd->mName = std::string("Pivot:") + nd->mName.data;
        ndAnim = nd;

        //Add the attachment node to it
        nd->mNumChildren = 1;
        nd->mChildren = new aiNode*[1];
        nd->mChildren[0] = new aiNode();
        nd->mChildren[0]->mParent = nd;
        nd->mChildren[0]->mTransformation.a4 = -src.pivotPos.x;
        nd->mChildren[0]->mTransformation.b4 = -src.pivotPos.y;
        nd->mChildren[0]->mTransformation.c4 = -src.pivotPos.z;
        SetupNodeName(nd->mChildren[0], src);

        //Update the attachment node
        nd = nd->mChildren[0];

        //Push attachment, if the object came from an external file
        if (obj) {
            attach.push_back(AttachmentInfo(obj,nd));
        }
    }

    // If object is a light source - setup a corresponding ai structure
    else if (src.type == LWS::NodeDesc::LIGHT) {
        aiLight* lit = *lightOut++ = new aiLight();

        // compute final light color
        lit->mColorDiffuse = lit->mColorSpecular = src.lightColor*src.lightIntensity;

        // name to attach light to node -> unique due to LWs indexing system
        lit->mName = nd->mName;

        // determine light type and setup additional members
        if (src.lightType == 2) { /* spot light */

            lit->mType = aiLightSource_SPOT;
            lit->mAngleInnerCone = (float)AI_DEG_TO_RAD( src.lightConeAngle );
            lit->mAngleOuterCone = lit->mAngleInnerCone+(float)AI_DEG_TO_RAD( src.lightEdgeAngle );

        }
        else if (src.lightType == 1) { /* directional light source */
            lit->mType = aiLightSource_DIRECTIONAL;
        }
        else lit->mType = aiLightSource_POINT;

        // fixme: no proper handling of light falloffs yet
        if (src.lightFalloffType == 1)
            lit->mAttenuationConstant = 1.f;
        else if (src.lightFalloffType == 1)
            lit->mAttenuationLinear = 1.f;
        else
            lit->mAttenuationQuadratic = 1.f;
    }

    // If object is a camera - setup a corresponding ai structure
    else if (src.type == LWS::NodeDesc::CAMERA) {
        aiCamera* cam = *camOut++ = new aiCamera();

        // name to attach cam to node -> unique due to LWs indexing system
        cam->mName = nd->mName;
    }

    // Get the node transformation from the LWO key
    LWO::AnimResolver resolver(src.channels,fps);
    resolver.ExtractBindPose(ndAnim->mTransformation);

    // .. and construct animation channels
    aiNodeAnim* anim = NULL;

    if (first != last) {
        resolver.SetAnimationRange(first,last);
        resolver.ExtractAnimChannel(&anim,AI_LWO_ANIM_FLAG_SAMPLE_ANIMS|AI_LWO_ANIM_FLAG_START_AT_ZERO);
        if (anim) {
            anim->mNodeName = ndAnim->mName;
            animOut.push_back(anim);
        }
    }

    // Add children
    if (!src.children.empty()) {
        nd->mChildren = new aiNode*[src.children.size()];
        for (std::list<LWS::NodeDesc*>::iterator it = src.children.begin(); it != src.children.end(); ++it) {
            aiNode* ndd = nd->mChildren[nd->mNumChildren++] = new aiNode();
            ndd->mParent = nd;

            BuildGraph(ndd,**it,attach,batch,camOut,lightOut,animOut);
        }
    }
}